

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSampleComputeInstance *this)

{
  ImageSampleComputeInstance *this_local;
  
  logTestPlan(this);
  testResourceAccess(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageSampleComputeInstance::iterate (void)
{
	logTestPlan();
	return testResourceAccess();
}